

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void av1_free_above_context_buffers(CommonContexts *above_contexts)

{
  TXFM_CONTEXT ***pppTVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pppTVar1 = &above_contexts->txfm;
  uVar2 = 0;
  uVar4 = (ulong)(uint)above_contexts->num_planes;
  if (above_contexts->num_planes < 1) {
    uVar4 = uVar2;
  }
  for (; (long)uVar2 < (long)above_contexts->num_tile_rows; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; (uVar4 != uVar3 && (above_contexts->entropy[uVar3] != (ENTROPY_CONTEXT **)0x0));
        uVar3 = uVar3 + 1) {
      aom_free(above_contexts->entropy[uVar3][uVar2]);
      above_contexts->entropy[uVar3][uVar2] = (ENTROPY_CONTEXT *)0x0;
    }
    if (above_contexts->partition != (PARTITION_CONTEXT **)0x0) {
      aom_free(above_contexts->partition[uVar2]);
      above_contexts->partition[uVar2] = (PARTITION_CONTEXT *)0x0;
    }
    if (*pppTVar1 != (TXFM_CONTEXT **)0x0) {
      aom_free((*pppTVar1)[uVar2]);
      (*pppTVar1)[uVar2] = (TXFM_CONTEXT *)0x0;
    }
  }
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    aom_free(above_contexts->entropy[uVar2]);
    above_contexts->entropy[uVar2] = (ENTROPY_CONTEXT **)0x0;
  }
  aom_free(above_contexts->partition);
  above_contexts->partition = (PARTITION_CONTEXT **)0x0;
  aom_free(above_contexts->txfm);
  *pppTVar1 = (TXFM_CONTEXT **)0x0;
  above_contexts->num_planes = 0;
  above_contexts->num_tile_rows = 0;
  above_contexts->num_mi_cols = 0;
  return;
}

Assistant:

void av1_free_above_context_buffers(CommonContexts *above_contexts) {
  int i;
  const int num_planes = above_contexts->num_planes;

  for (int tile_row = 0; tile_row < above_contexts->num_tile_rows; tile_row++) {
    for (i = 0; i < num_planes; i++) {
      if (above_contexts->entropy[i] == NULL) break;
      aom_free(above_contexts->entropy[i][tile_row]);
      above_contexts->entropy[i][tile_row] = NULL;
    }
    if (above_contexts->partition != NULL) {
      aom_free(above_contexts->partition[tile_row]);
      above_contexts->partition[tile_row] = NULL;
    }

    if (above_contexts->txfm != NULL) {
      aom_free(above_contexts->txfm[tile_row]);
      above_contexts->txfm[tile_row] = NULL;
    }
  }
  for (i = 0; i < num_planes; i++) {
    aom_free(above_contexts->entropy[i]);
    above_contexts->entropy[i] = NULL;
  }
  aom_free(above_contexts->partition);
  above_contexts->partition = NULL;

  aom_free(above_contexts->txfm);
  above_contexts->txfm = NULL;

  above_contexts->num_tile_rows = 0;
  above_contexts->num_mi_cols = 0;
  above_contexts->num_planes = 0;
}